

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O2

void __thiscall ipx::KKTSolverBasis::_Factorize(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  ipxint *piVar1;
  bool bVar2;
  Int IVar3;
  double *colscale;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  Maxvolume maxvol;
  Maxvolume local_68;
  
  uVar5 = this->model_->num_cols_ + this->model_->num_rows_;
  (info->super_ipx_info).errflag = 0;
  this->factorized_ = false;
  this->iter_ = 0;
  this->basis_changes_ = 0;
  uVar4 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    dVar7 = Iterate::ScalingFactor(iterate,(Int)uVar4);
    (this->colscale_)._M_data[uVar4] = dVar7;
  }
  dVar7 = Iterate::pobjective(iterate);
  dVar8 = Iterate::dobjective(iterate);
  if ((dVar7 < dVar8) ||
     ((DropPrimal(this,iterate,info), (info->super_ipx_info).errflag == 0 &&
      (DropDual(this,iterate,info), (info->super_ipx_info).errflag == 0)))) {
    Maxvolume::Maxvolume(&local_68,this->control_);
    colscale = (this->colscale_)._M_data;
    if ((this->control_->parameters_).super_ipx_parameters.update_heuristic == 0) {
      IVar3 = Maxvolume::RunSequential(&local_68,colscale,this->basis_);
    }
    else {
      IVar3 = Maxvolume::RunHeuristic(&local_68,colscale,this->basis_);
    }
    (info->super_ipx_info).errflag = IVar3;
    IVar3 = Maxvolume::updates(&local_68);
    piVar1 = &(info->super_ipx_info).updates_ipm;
    *piVar1 = *piVar1 + IVar3;
    Maxvolume::time(&local_68,(time_t *)colscale);
    (info->super_ipx_info).time_maxvol = extraout_XMM0_Qa + (info->super_ipx_info).time_maxvol;
    IVar3 = Maxvolume::updates(&local_68);
    this->basis_changes_ = this->basis_changes_ + IVar3;
    if ((info->super_ipx_info).errflag == 0) {
      bVar2 = Basis::FactorizationIsFresh(this->basis_);
      if (!bVar2) {
        IVar3 = Basis::Factorize(this->basis_);
        (info->super_ipx_info).errflag = IVar3;
        if (IVar3 != 0) {
          return;
        }
      }
      SplittedNormalMatrix::Prepare
                (&this->splitted_normal_matrix_,this->basis_,(this->colscale_)._M_data);
      this->factorized_ = true;
    }
  }
  return;
}

Assistant:

void KKTSolverBasis::_Factorize(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    info->errflag = 0;
    factorized_ = false;
    iter_ = 0;
    basis_changes_ = 0;

    for (Int j = 0; j < n+m; j++)
        colscale_[j] = iterate->ScalingFactor(j);

    // Remove degenerate variables unless the primal objective is smaller than
    // the dual objective. In the latter case the model might be infeasible or
    // unbounded. In order not to affect an infeasibility test in the IPM (not
    // yet implemented) we do not remove variables if the model looks
    // infeasible.
    if (iterate->pobjective() >= iterate->dobjective()) {
        DropPrimal(iterate, info);
        if (info->errflag)
            return;
        DropDual(iterate, info);
        if (info->errflag)
            return;
    }

    // Run maxvolume ("Russian algorithm").
    Maxvolume maxvol(control_);
    if (control_.update_heuristic() == 0) {
        info->errflag = maxvol.RunSequential(&colscale_[0], basis_);
    } else {
        info->errflag = maxvol.RunHeuristic(&colscale_[0], basis_);
    }
    info->updates_ipm += maxvol.updates();
    info->time_maxvol += maxvol.time();
    basis_changes_ += maxvol.updates();
    if (info->errflag)
        return;

    // Refactorize and build preconditioned normal matrix.
    if (!basis_.FactorizationIsFresh()) {
        info->errflag = basis_.Factorize();
        if (info->errflag)
            return;
    }
    splitted_normal_matrix_.Prepare(basis_, &colscale_[0]);

    factorized_ = true;
}